

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall HdlcAnalyzer::BitSyncProcessFlags(HdlcAnalyzer *this)

{
  U64 UVar1;
  char cVar2;
  bool bVar3;
  BitState BVar4;
  U64 UVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  vector<HdlcByte,_std::allocator<HdlcByte>_> flags;
  Frame frame;
  HdlcByte *local_78;
  iterator iStack_70;
  HdlcByte *local_68;
  HdlcByte local_60;
  undefined8 uStack_48;
  undefined2 local_40;
  vector<Frame,_std::allocator<Frame>_> *local_38;
  
  local_78 = (HdlcByte *)0x0;
  iStack_70._M_current = (HdlcByte *)0x0;
  local_68 = (HdlcByte *)0x0;
  bVar10 = false;
  while (cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc),
        cVar2 != '\0') {
    bVar3 = FlagComing(this);
    if (bVar3) {
      local_60._16_8_ = local_60._16_8_ & 0xffffffffffffff00;
      local_60.startSample = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      local_60.endSample = AnalyzerChannelData::GetSampleNumber();
      if (iStack_70._M_current == local_68) {
        std::vector<HdlcByte,std::allocator<HdlcByte>>::_M_realloc_insert<HdlcByte_const&>
                  ((vector<HdlcByte,std::allocator<HdlcByte>> *)&local_78,iStack_70,&local_60);
      }
      else {
        (iStack_70._M_current)->value = local_60.value;
        (iStack_70._M_current)->escaped = local_60.escaped;
        *(undefined6 *)&(iStack_70._M_current)->field_0x12 = local_60._18_6_;
        (iStack_70._M_current)->startSample = local_60.startSample;
        (iStack_70._M_current)->endSample = local_60.endSample;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc);
      uVar8 = (uint)this->mHdlc;
      if (cVar2 == '\0') {
        AnalyzerChannelData::Advance(uVar8);
        BVar4 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar4;
        AnalyzerChannelData::Advance((uint)this->mHdlc);
      }
      else {
        AnalyzerChannelData::Advance(uVar8);
        BVar4 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar4;
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      bVar10 = true;
    }
    else {
      if (bVar10) goto LAB_00108a79;
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  if (iStack_70._M_current != local_78) {
    uVar9 = 0;
    uVar7 = 1;
    do {
      UVar5 = local_78[uVar9].startSample;
      UVar1 = local_78[uVar9].endSample;
      Frame::Frame((Frame *)&local_60);
      local_40 = 0;
      local_60.value = '\x02';
      local_60.escaped = false;
      local_60._18_6_ = 0;
      uStack_48 = 0;
      local_60.startSample = UVar5;
      local_60.endSample = UVar1;
      std::vector<Frame,_std::allocator<Frame>_>::push_back
                (&this->mResultFrames,(value_type *)&local_60);
      Frame::~Frame((Frame *)&local_60);
      uVar9 = ((long)iStack_70._M_current - (long)local_78 >> 3) * -0x5555555555555555;
      bVar10 = uVar7 <= uVar9;
      lVar6 = uVar9 - uVar7;
      uVar9 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar10 && lVar6 != 0);
  }
  if (iStack_70._M_current != local_78) {
    iStack_70._M_current = local_78;
  }
  UVar5 = AnalyzerChannelData::GetSampleNumber();
  lVar6 = AnalyzerChannelData::GetSampleNumber();
  uVar8 = this->mSamplesIn8Bits;
  Frame::Frame((Frame *)&local_60);
  local_60.endSample = lVar6 + (ulong)uVar8;
  local_40 = 7;
  local_60.value = '\0';
  local_60.escaped = false;
  local_60._18_6_ = 0;
  uStack_48 = 0;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(undefined8 *)&this->field_0xb0 = 0;
  *(undefined2 *)&this->field_0xb8 = 7;
  *(U64 *)&this->mAbtFrame = UVar5;
  *(U64 *)&this->field_0xa0 = local_60.endSample;
  local_60.startSample = UVar5;
  Frame::~Frame((Frame *)&local_60);
  AnalyzerChannelData::AdvanceToNextEdge();
  this->mAbortFrame = true;
LAB_00108a79:
  if ((this->mAbortFrame == false) && (iStack_70._M_current != local_78)) {
    local_38 = &this->mResultFrames;
    uVar8 = 1;
    uVar9 = 0;
    do {
      UVar5 = local_78[uVar9].startSample;
      UVar1 = local_78[uVar9].endSample;
      Frame::Frame((Frame *)&local_60);
      local_40 = 0;
      local_60.value = '\x02';
      local_60.escaped = false;
      local_60._18_6_ = 0;
      uStack_48 = 0;
      if (((long)iStack_70._M_current - (long)local_78 >> 3) * -0x5555555555555555 - 1U == uVar9) {
        local_60.value = '\0';
        local_60.escaped = false;
        local_60._18_6_ = 0;
      }
      local_60.startSample = UVar5;
      local_60.endSample = UVar1;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(local_38,(value_type *)&local_60);
      Frame::~Frame((Frame *)&local_60);
      uVar9 = (ulong)uVar8;
      uVar7 = ((long)iStack_70._M_current - (long)local_78 >> 3) * -0x5555555555555555;
      uVar8 = uVar8 + 1;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if (local_78 != (HdlcByte *)0x0) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void HdlcAnalyzer::BitSyncProcessFlags()
{
    bool flagEncountered = false;
    vector<HdlcByte> flags;
    for( ;; )
    {
        if( AbortComing() )
        {
            // Show fill flags
            for( U32 i = 0; i < flags.size(); ++i )
            {
                Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
                AddFrameToResults( frame );
            }
            flags.clear();

            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, mHdlc->GetSampleNumber(), mHdlc->GetSampleNumber() + mSamplesIn8Bits );

            mHdlc->AdvanceToNextEdge();
            flagEncountered = false;
            mAbortFrame = true;

            break;
        }

        if( FlagComing() )
        {
            HdlcByte bs;
            bs.value = 0;

            bs.startSample = mHdlc->GetSampleNumber();
            mHdlc->AdvanceToNextEdge();
            bs.endSample = mHdlc->GetSampleNumber();

            flags.push_back( bs );

            if( mHdlc->WouldAdvancingCauseTransition( mSamplesInHalfPeriod * 1.5 ) )
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->AdvanceToNextEdge();
            }
            else
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
            }

            flagEncountered = true;
        }
        else // non-flag
        {
            if( flagEncountered )
            {
                break;
            }
            else // non-flag byte before a byte-flag is ignored
            {
                mHdlc->AdvanceToNextEdge();
            }
        }
    }

    if( !mAbortFrame )
    {
        for( U32 i = 0; i < flags.size(); ++i )
        {
            Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
            if( i == flags.size() - 1 )
            {
                frame.mData1 = HDLC_FLAG_START;
            }
            AddFrameToResults( frame );
        }
    }
}